

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageAtomicOperationTests.cpp
# Opt level: O2

deInt32 vkt::image::anon_unknown_2::computeBinaryAtomicOperationResult
                  (AtomicOperation op,deInt32 a,deInt32 b)

{
  switch(op) {
  case ATOMIC_OPERATION_ADD:
    return b + a;
  case ATOMIC_OPERATION_MIN:
    if (a < b) {
      b = a;
    }
    return b;
  case ATOMIC_OPERATION_MAX:
    if (b < a) {
      b = a;
    }
    return b;
  case ATOMIC_OPERATION_AND:
    return b & a;
  case ATOMIC_OPERATION_OR:
    return b | a;
  case ATOMIC_OPERATION_XOR:
    return b ^ a;
  case ATOMIC_OPERATION_EXCHANGE:
    break;
  default:
    b = -1;
  }
  return b;
}

Assistant:

static deInt32 computeBinaryAtomicOperationResult (const AtomicOperation op, const deInt32 a, const deInt32 b)
{
	switch (op)
	{
		case ATOMIC_OPERATION_ADD:			return a + b;
		case ATOMIC_OPERATION_MIN:			return de::min(a, b);
		case ATOMIC_OPERATION_MAX:			return de::max(a, b);
		case ATOMIC_OPERATION_AND:			return a & b;
		case ATOMIC_OPERATION_OR:			return a | b;
		case ATOMIC_OPERATION_XOR:			return a ^ b;
		case ATOMIC_OPERATION_EXCHANGE:		return b;
		default:
			DE_ASSERT(false);
			return -1;
	}
}